

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall
Generator::generateTypeInfo(Generator *this,QByteArray *typeName,bool allowEmptyName)

{
  FILE *__stream;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isBuiltinType(typeName);
  if (!bVar1) {
    __stream = (FILE *)this->out;
    uVar3 = QtPrivate::indexOf<QByteArray,QByteArray>(&this->strings,typeName,0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      fprintf(__stream,"0x%.8x | %d",0x80000000,uVar3 & 0xffffffff);
      return;
    }
    goto LAB_0010d68d;
  }
  local_28 = "qreal";
  bVar1 = operator==(typeName,&local_28);
  if (bVar1) {
    pcVar4 = "QReal";
    goto switchD_0010d282_caseD_1;
  }
  uVar2 = nameToBuiltinType(typeName);
  pcVar4 = "Bool";
  switch(uVar2) {
  case 1:
    break;
  case 2:
    pcVar4 = "Int";
    break;
  case 3:
    pcVar4 = "UInt";
    break;
  case 4:
    pcVar4 = "LongLong";
    break;
  case 5:
    pcVar4 = "ULongLong";
    break;
  case 6:
    pcVar4 = "Double";
    break;
  case 7:
    pcVar4 = "QChar";
    break;
  case 8:
    pcVar4 = "QVariantMap";
    break;
  case 9:
    pcVar4 = "QVariantList";
    break;
  case 10:
    pcVar4 = "QString";
    break;
  case 0xb:
    pcVar4 = "QStringList";
    break;
  case 0xc:
    pcVar4 = anon_var_dwarf_40933;
    break;
  case 0xd:
    pcVar4 = "QBitArray";
    break;
  case 0xe:
    pcVar4 = "QDate";
    break;
  case 0xf:
    pcVar4 = "QTime";
    break;
  case 0x10:
    pcVar4 = "QDateTime";
    break;
  case 0x11:
    pcVar4 = "QUrl";
    break;
  case 0x12:
    pcVar4 = "QLocale";
    break;
  case 0x13:
    pcVar4 = "QRect";
    break;
  case 0x14:
    pcVar4 = "QRectF";
    break;
  case 0x15:
    pcVar4 = "QSize";
    break;
  case 0x16:
    pcVar4 = "QSizeF";
    break;
  case 0x17:
    pcVar4 = "QLine";
    break;
  case 0x18:
    pcVar4 = "QLineF";
    break;
  case 0x19:
    pcVar4 = "QPoint";
    break;
  case 0x1a:
    pcVar4 = "QPointF";
    break;
  case 0x1b:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
switchD_0010d282_caseD_1b:
    fprintf((FILE *)this->out,"%4d",(ulong)uVar2);
    goto LAB_0010d1f5;
  case 0x1c:
    pcVar4 = "QVariantHash";
    break;
  case 0x1d:
    pcVar4 = "QEasingCurve";
    break;
  case 0x1e:
    pcVar4 = "QUuid";
    break;
  case 0x1f:
    pcVar4 = "VoidStar";
    break;
  case 0x20:
    pcVar4 = "Long";
    break;
  case 0x21:
    pcVar4 = "Short";
    break;
  case 0x22:
    pcVar4 = "Char";
    break;
  case 0x23:
    pcVar4 = "ULong";
    break;
  case 0x24:
    pcVar4 = "UShort";
    break;
  case 0x25:
    pcVar4 = "UChar";
    break;
  case 0x26:
    pcVar4 = "Float";
    break;
  case 0x27:
    pcVar4 = "QObjectStar";
    break;
  case 0x28:
    pcVar4 = "SChar";
    break;
  case 0x29:
    pcVar4 = "QVariant";
    break;
  case 0x2a:
    pcVar4 = "QModelIndex";
    break;
  case 0x2b:
    pcVar4 = "Void";
    break;
  case 0x2c:
    pcVar4 = "QRegularExpression";
    break;
  case 0x2d:
    pcVar4 = "QJsonValue";
    break;
  case 0x2e:
    pcVar4 = "QJsonObject";
    break;
  case 0x2f:
    pcVar4 = "QJsonArray";
    break;
  case 0x30:
    pcVar4 = "QJsonDocument";
    break;
  case 0x31:
    pcVar4 = "QByteArrayList";
    break;
  case 0x32:
    pcVar4 = "QPersistentModelIndex";
    break;
  case 0x33:
    pcVar4 = "Nullptr";
    break;
  case 0x34:
    pcVar4 = "QCborSimpleType";
    break;
  case 0x35:
    pcVar4 = "QCborValue";
    break;
  case 0x36:
    pcVar4 = "QCborArray";
    break;
  case 0x37:
    pcVar4 = "QCborMap";
    break;
  case 0x38:
    pcVar4 = "Char16";
    break;
  case 0x39:
    pcVar4 = "Char32";
    break;
  case 0x3a:
    pcVar4 = "QVariantPair";
    break;
  case 0x3f:
    pcVar4 = "Float16";
    break;
  default:
    switch(uVar2) {
    case 0x1000:
      pcVar4 = "QFont";
      break;
    case 0x1001:
      pcVar4 = "QPixmap";
      break;
    case 0x1002:
      pcVar4 = "QBrush";
      break;
    case 0x1003:
      pcVar4 = "QColor";
      break;
    case 0x1004:
      pcVar4 = "QPalette";
      break;
    case 0x1005:
      pcVar4 = "QIcon";
      break;
    case 0x1006:
      pcVar4 = "QImage";
      break;
    case 0x1007:
      pcVar4 = "QPolygon";
      break;
    case 0x1008:
      pcVar4 = "QRegion";
      break;
    case 0x1009:
      pcVar4 = "QBitmap";
      break;
    case 0x100a:
      pcVar4 = "QCursor";
      break;
    case 0x100b:
      pcVar4 = "QKeySequence";
      break;
    case 0x100c:
      pcVar4 = "QPen";
      break;
    case 0x100d:
      pcVar4 = "QTextLength";
      break;
    case 0x100e:
      pcVar4 = "QTextFormat";
      break;
    case 0x100f:
      goto switchD_0010d282_caseD_1b;
    case 0x1010:
      pcVar4 = "QTransform";
      break;
    case 0x1011:
      pcVar4 = "QMatrix4x4";
      break;
    case 0x1012:
      pcVar4 = "QVector2D";
      break;
    case 0x1013:
      pcVar4 = "QVector3D";
      break;
    case 0x1014:
      pcVar4 = "QVector4D";
      break;
    case 0x1015:
      pcVar4 = "QQuaternion";
      break;
    case 0x1016:
      pcVar4 = "QPolygonF";
      break;
    case 0x1017:
      pcVar4 = "QColorSpace";
      break;
    default:
      if (uVar2 != 0x2000) goto switchD_0010d282_caseD_1b;
      pcVar4 = "QSizePolicy";
    }
  }
switchD_0010d282_caseD_1:
  fprintf((FILE *)this->out,"QMetaType::%s",pcVar4);
LAB_0010d1f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0010d68d:
  __stack_chk_fail();
}

Assistant:

void Generator::generateTypeInfo(const QByteArray &typeName, bool allowEmptyName)
{
    Q_UNUSED(allowEmptyName);
    if (isBuiltinType(typeName)) {
        int type;
        const char *valueString;
        if (typeName == "qreal") {
            type = QMetaType::UnknownType;
            valueString = "QReal";
        } else {
            type = nameToBuiltinType(typeName);
            valueString = metaTypeEnumValueString(type);
        }
        if (valueString) {
            fprintf(out, "QMetaType::%s", valueString);
        } else {
            Q_ASSERT(type != QMetaType::UnknownType);
            fprintf(out, "%4d", type);
        }
    } else {
        Q_ASSERT(!typeName.isEmpty() || allowEmptyName);
        fprintf(out, "0x%.8x | %d", IsUnresolvedType, stridx(typeName));
    }
}